

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

void __thiscall soul::heart::Parser::parseFunctionParams(Parser *this,Function *f)

{
  BlockCode *pBVar1;
  bool bVar2;
  IntrinsicType IVar3;
  FunctionType newType;
  Module *this_00;
  Variable *o;
  ulong uVar4;
  string_view s;
  undefined1 auVar5 [16];
  string local_160;
  allocator<char> local_139;
  string local_138;
  undefined1 local_118 [8];
  string intrin;
  Type local_e8;
  char *local_d0;
  char *local_c8;
  int local_bc;
  char *local_b8;
  Role local_ac;
  pool_ref<soul::heart::Variable> local_a8;
  Identifier local_a0;
  Identifier name;
  CodeLocation paramLocation;
  Type type;
  undefined1 local_58 [8];
  FunctionParseState state;
  Function *f_local;
  Parser *this_local;
  
  state.currentBlock = (BlockCode *)f;
  FunctionParseState::FunctionParseState((FunctionParseState *)local_58,f);
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x4d2078);
  if (!bVar2) {
    do {
      readValueOrRefType((Type *)&paramLocation.location,this);
      CodeLocation::CodeLocation
                ((CodeLocation *)&name,
                 &(this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                  ).location);
      local_a0 = parseVariableIdentifier(this);
      pBVar1 = state.currentBlock + 3;
      this_00 = pool_ptr<soul::Module>::operator->(&this->module);
      local_ac = parameter;
      o = Module::
          allocate<soul::heart::Variable,soul::CodeLocation,soul::Type&,soul::Identifier&,soul::heart::Variable::Role>
                    (this_00,(CodeLocation *)&name,(Type *)&paramLocation.location,&local_a0,
                     &local_ac);
      pool_ref<soul::heart::Variable>::pool_ref<soul::heart::Variable,void>(&local_a8,o);
      ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_4UL>::push_back
                ((ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_4UL> *)&pBVar1->code
                 ,&local_a8);
      pool_ref<soul::heart::Variable>::~pool_ref(&local_a8);
      local_b8 = ",";
      bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matchIf<soul::TokenType>
                        (&this->
                          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                         ,(TokenType)",");
      if (bVar2) {
        local_bc = 3;
      }
      else {
        local_c8 = ")";
        Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        ::expect<soul::TokenType>
                  (&this->
                    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                   ,(TokenType)0x4d2078);
        local_bc = 2;
      }
      CodeLocation::~CodeLocation((CodeLocation *)&name);
      Type::~Type((Type *)&paramLocation.location);
    } while (local_bc != 2);
  }
  bVar2 = FunctionType::isEvent((FunctionType *)(state.currentBlock + 0xd));
  if (!bVar2) {
    local_d0 = "->";
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x4aef0f);
    readValueType(&local_e8,this);
    Type::operator=((Type *)&state.currentBlock[1].code,&local_e8);
    Type::~Type(&local_e8);
  }
  parseAnnotation(this,(Annotation *)&state.currentBlock[8].code);
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x4ad30b);
  if (!bVar2) {
    intrin.field_2._8_8_ = anon_var_dwarf_d4765;
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)"{");
  }
  pBVar1 = state.currentBlock + 8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"intrin",&local_139);
  std::__cxx11::string::string((string *)&local_160);
  Annotation::getString((string *)local_118,(Annotation *)&pBVar1->code,&local_138,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_138);
  std::allocator<char>::~allocator(&local_139);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    auVar5 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_118);
    s._M_str = auVar5._8_8_;
    s._M_len = (size_t)s._M_str;
    IVar3 = getIntrinsicTypeFromName(auVar5._0_8_,s);
    *(IntrinsicType *)&state.currentBlock[0xb].code.data = IVar3;
    newType = FunctionType::intrinsic();
    FunctionType::operator=((FunctionType *)(state.currentBlock + 0xd),newType);
  }
  std::__cxx11::string::~string((string *)local_118);
  FunctionParseState::~FunctionParseState((FunctionParseState *)local_58);
  return;
}

Assistant:

void parseFunctionParams (heart::Function& f)
    {
        FunctionParseState state (f);

        if (! matchIf (HEARTOperator::closeParen))
        {
            for (;;)
            {
                auto type = readValueOrRefType();
                auto paramLocation = location;
                auto name = parseVariableIdentifier();
                f.parameters.push_back (module->allocate<heart::Variable> (std::move (paramLocation), type, name,
                                                                           heart::Variable::Role::parameter));

                if (matchIf (HEARTOperator::comma))
                    continue;

                expect (HEARTOperator::closeParen);
                break;
            }
        }

        if (! f.functionType.isEvent())
        {
            expect (HEARTOperator::rightArrow);
            f.returnType = readValueType();
        }

        parseAnnotation (f.annotation);

        if (! matchIf (HEARTOperator::semicolon))
            expect (HEARTOperator::openBrace);

        auto intrin = f.annotation.getString ("intrin");

        if (! intrin.empty())
        {
            f.intrinsicType = getIntrinsicTypeFromName (intrin);
            f.functionType = heart::FunctionType::intrinsic();
        }
    }